

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqlite_class.cpp
# Opt level: O0

void __thiscall test_cpp_db_sqlite::test_result::test_result(test_result *this)

{
  test_result *this_local;
  
  SQLiteTestFixture::SQLiteTestFixture(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_result)
{
    cpp_db::result r(cpp_db::statement("select COL1, COL2 from TEST_TABLE;", *con).execute());
    BOOST_CHECK_EQUAL(r.get_column_count(), 2);
    BOOST_CHECK_EQUAL(r.get_column_name(0), "COL1");
    BOOST_CHECK_EQUAL(r.get_column_name(1), "COL2");
    BOOST_CHECK_EQUAL(r.get_column_index("COL1"), 0);
    BOOST_CHECK_EQUAL(r.get_column_index("COL2"), 1);
    BOOST_CHECK(!r.is_eof());
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(r.get_column_value(0)), 1);
    BOOST_CHECK_EQUAL(cpp_db::value_of<std::string>(r.get_column_value(1)), "first");
    BOOST_CHECK_NO_THROW(r.move_next());
    BOOST_CHECK(!r.is_eof());
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(r.get_column_value("COL1")), 2);
    BOOST_CHECK_EQUAL(cpp_db::value_of<std::string>(r.get_column_value("COL2")), "second");
    BOOST_CHECK_NO_THROW(r.move_next());
    BOOST_CHECK(!r.is_eof());
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(r.get_column_value(0)), 3);
    BOOST_CHECK_EQUAL(cpp_db::value_of<std::string>(r.get_column_value(1)), "third");
    BOOST_CHECK_NO_THROW(r.move_next());
    BOOST_CHECK(r.is_eof());

    BOOST_CHECK_THROW(cpp_db::result(cpp_db::statement(*con).execute()), cpp_db::db_exception);
}